

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

void __thiscall
QPDF::readStream(QPDF *this,QPDFObjectHandle *object,QPDFObjGen og,qpdf_offset_t offset)

{
  long *plVar1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  int iVar4;
  qpdf_offset_t offset_00;
  unsigned_long_long i;
  QPDFExc *pQVar5;
  QPDFObjectHandle length_obj;
  QPDFObjectHandle local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  QPDFObjectHandle local_70 [2];
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  validateStreamLineEnd(this,object,og,offset);
  offset_00 = (**(code **)(**(long **)&(((this->m)._M_t.
                                         super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                         .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl
                                        )->file).
                                       super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                          0x20))();
  local_d8._0_8_ = (element_type *)local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"/Length","");
  QPDFObjectHandle::getKey(&local_e8,(string *)object);
  if ((element_type *)local_d8._0_8_ != (element_type *)local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8._0_8_ + 1);
  }
  bVar3 = QPDFObjectHandle::isInteger(&local_e8);
  if (!bVar3) {
    bVar3 = QPDFObjectHandle::isNull(&local_e8);
    pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
    if (bVar3) {
      local_d8._0_8_ = (element_type *)local_c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"stream dictionary lacks /Length key","");
      damagedPDF(pQVar5,this,offset,(string *)local_d8);
      __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    local_d8._0_8_ = (element_type *)local_c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"/Length key in stream dictionary is not an integer","");
    damagedPDF(pQVar5,this,offset,(string *)local_d8);
    __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  i = QPDFObjectHandle::getUIntValue(&local_e8);
  plVar1 = *(long **)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  (**(code **)(*plVar1 + 0x28))(plVar1,offset_00,0);
  plVar1 = *(long **)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  if ((long)i < 0) {
    QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error(i);
  }
  (**(code **)(*plVar1 + 0x28))(plVar1,i,1);
  _Var2._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  ::qpdf::Tokenizer::readToken
            ((Token *)local_d8,&(_Var2._M_head_impl)->tokenizer,
             ((_Var2._M_head_impl)->file).
             super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &(_Var2._M_head_impl)->last_object_description,true,0);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"endstream","");
  if ((local_d8._0_4_ == tt_word) && (local_c8._0_8_ == local_48)) {
    if (local_c8._0_8_ == 0) {
      bVar3 = true;
    }
    else {
      iVar4 = bcmp((void *)local_d8._8_8_,local_50,local_c8._0_8_);
      bVar3 = iVar4 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p != &local_80) {
    operator_delete(local_90._M_p,(ulong)(local_80._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._24_8_ != &local_a0) {
    operator_delete((void *)local_c8._24_8_,local_a0._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8)) {
    operator_delete((void *)local_d8._8_8_,local_c8._8_8_ + 1);
  }
  if (bVar3) {
    if (local_e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    local_70[0].super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (object->super_BaseHandle).obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_70[0].super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (object->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_70[0].super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_70[0].super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_70[0].super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_70[0].super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_70[0].super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    ::qpdf::Stream::Stream((Stream *)local_d8,this,og,local_70,offset_00,i);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_d8._8_8_ + 8) = *(_Atomic_word *)(local_d8._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_d8._8_8_ + 8) = *(_Atomic_word *)(local_d8._8_8_ + 8) + 1;
      }
    }
    (object->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_d8._0_8_;
    this_00 = (object->super_BaseHandle).obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (object->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
    if (local_70[0].super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70[0].super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    return;
  }
  pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
  local_d8._0_8_ = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"expected endstream","");
  damagedPDF(pQVar5,this,(string *)local_d8);
  __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

void
QPDF::readStream(QPDFObjectHandle& object, QPDFObjGen og, qpdf_offset_t offset)
{
    validateStreamLineEnd(object, og, offset);

    // Must get offset before accessing any additional objects since resolving a previously
    // unresolved indirect object will change file position.
    qpdf_offset_t stream_offset = m->file->tell();
    size_t length = 0;

    try {
        auto length_obj = object.getKey("/Length");

        if (!length_obj.isInteger()) {
            if (length_obj.isNull()) {
                QTC::TC("qpdf", "QPDF stream without length");
                throw damagedPDF(offset, "stream dictionary lacks /Length key");
            }
            QTC::TC("qpdf", "QPDF stream length not integer");
            throw damagedPDF(offset, "/Length key in stream dictionary is not an integer");
        }

        length = toS(length_obj.getUIntValue());
        // Seek in two steps to avoid potential integer overflow
        m->file->seek(stream_offset, SEEK_SET);
        m->file->seek(toO(length), SEEK_CUR);
        if (!readToken(*m->file).isWord("endstream")) {
            QTC::TC("qpdf", "QPDF missing endstream");
            throw damagedPDF("expected endstream");
        }
    } catch (QPDFExc& e) {
        if (m->attempt_recovery) {
            warn(e);
            length = recoverStreamLength(m->file, og, stream_offset);
        } else {
            throw;
        }
    }
    object = QPDFObjectHandle(qpdf::Stream(*this, og, object, stream_offset, length));
}